

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O1

int Gia_ManFaultAnalyze(sat_solver *pSat,Vec_Int_t *vPars,Vec_Int_t *vMap,Vec_Int_t *vLits,int Iter)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  int Lit;
  timespec ts;
  int local_5c;
  uint local_58;
  uint local_54;
  long local_50;
  Vec_Int_t *local_48;
  timespec local_40;
  
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    local_50 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    local_50 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  if (vPars->nSize != vMap->nSize) {
    __assert_fail("Vec_IntSize(vPars) == Vec_IntSize(vMap)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x4ec,
                  "int Gia_ManFaultAnalyze(sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  vLits->nSize = 0;
  local_54 = Iter;
  if (0 < vMap->nSize) {
    lVar7 = 0;
    do {
      Vec_IntPush(vLits,vMap->pArray[lVar7]);
      lVar7 = lVar7 + 1;
    } while (lVar7 < vMap->nSize);
  }
  uVar6 = (ulong)(uint)vPars->nSize;
  iVar3 = 0;
  local_5c = 0;
  uVar8 = 0;
  local_48 = vMap;
  if (0 < vPars->nSize) {
    lVar7 = 0;
    uVar8 = 0;
    local_5c = 0;
    do {
      if (vLits->nSize <= lVar7) {
LAB_0058faae:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (vLits->pArray[lVar7] != 0) {
        if (vLits->pArray[lVar7] != 1) {
          __assert_fail("Vec_IntEntry(vLits, v) == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                        ,0x4f4,
                        "int Gia_ManFaultAnalyze(sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                       );
        }
        if (vPars->pArray[lVar7] < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        uVar8 = uVar8 + 1;
        local_58 = vPars->pArray[lVar7] * 2;
        iVar4 = sat_solver_solve(pSat,(lit *)&local_58,(lit *)&local_54,100,0,0,0);
        if (iVar4 == -1) {
          if (local_48->nSize <= lVar7) goto LAB_0058faae;
          if (local_48->pArray[lVar7] != 1) {
            __assert_fail("Vec_IntEntry(vMap, v) == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                          ,0x4fd,
                          "int Gia_ManFaultAnalyze(sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                         );
          }
          local_48->pArray[lVar7] = 0;
          if ((int)local_58 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x131,"int Abc_LitNot(int)");
          }
          local_5c = local_5c + 1;
          local_58 = local_58 ^ 1;
        }
        else if (iVar4 != 0) {
          if (0 < vPars->nSize) {
            piVar2 = vPars->pArray;
            lVar5 = 0;
            do {
              if (vLits->nSize <= lVar5) goto LAB_0058faae;
              if (vLits->pArray[lVar5] != 0) {
                uVar1 = piVar2[lVar5];
                if (((int)uVar1 < 0) || (pSat->size <= (int)uVar1)) {
                  __assert_fail("v >= 0 && v < s->size",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                                ,0xda,"int sat_solver_var_value(sat_solver *, int)");
                }
                if (pSat->model[uVar1] == 1) {
                  vLits->pArray[lVar5] = 0;
                }
              }
              lVar5 = lVar5 + 1;
            } while (lVar5 < vPars->nSize);
          }
          if (vLits->nSize <= lVar7) goto LAB_0058faae;
          if (vLits->pArray[lVar7] != 0) {
            __assert_fail("Vec_IntEntry(vLits, v) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                          ,0x507,
                          "int Gia_ManFaultAnalyze(sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                         );
          }
        }
      }
      lVar7 = lVar7 + 1;
      uVar6 = (ulong)vPars->nSize;
    } while (lVar7 < (long)uVar6);
  }
  iVar4 = local_48->nSize;
  if (0 < (long)iVar4) {
    lVar7 = 0;
    iVar3 = 0;
    do {
      iVar3 = iVar3 + (uint)(0 < local_48->pArray[lVar7]);
      lVar7 = lVar7 + 1;
    } while (iVar4 != lVar7);
  }
  printf("Iteration %3d has determined %5d (out of %5d) parameters after %6d SAT calls.  ",
         (ulong)local_54,(ulong)(uint)(iVar4 - iVar3),uVar6,(ulong)uVar8);
  iVar4 = 3;
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  lVar7 = lVar7 + local_50;
  Abc_Print(iVar4,"%s =","Time");
  Abc_Print(iVar4,"%9.2f sec\n",(double)lVar7 / 1000000.0);
  return local_5c;
}

Assistant:

int Gia_ManFaultAnalyze( sat_solver * pSat, Vec_Int_t * vPars, Vec_Int_t * vMap, Vec_Int_t * vLits, int Iter )
{
    int nConfLimit = 100;
    int status, i, v, iVar, Lit;
    int nUnsats = 0, nRuns = 0;
    abctime clk = Abc_Clock();
    assert( Vec_IntSize(vPars) == Vec_IntSize(vMap) );
    // check presence of each variable
    Vec_IntClear( vLits );
    Vec_IntAppend( vLits, vMap );
    for ( v = 0; v < Vec_IntSize(vPars); v++ )
    {
        if ( !Vec_IntEntry(vLits, v) )
            continue;
        assert( Vec_IntEntry(vLits, v) == 1 );
        nRuns++;
        Lit = Abc_Var2Lit( Vec_IntEntry(vPars, v), 0 );
        status = sat_solver_solve( pSat, &Lit, &Lit+1, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( status == l_Undef )
            continue;
        if ( status == l_False )
        {
            nUnsats++;
            assert( Vec_IntEntry(vMap, v) == 1 );
            Vec_IntWriteEntry( vMap, v, 0 );
            Lit = Abc_LitNot(Lit);
            //status = sat_solver_addclause( pSat, &Lit, &Lit+1 );
            //assert( status );
            continue;
        }
        Vec_IntForEachEntry( vPars, iVar, i )
            if ( Vec_IntEntry(vLits, i) && sat_solver_var_value(pSat, iVar) )
                Vec_IntWriteEntry( vLits, i, 0 );
        assert( Vec_IntEntry(vLits, v) == 0 );
    }
    printf( "Iteration %3d has determined %5d (out of %5d) parameters after %6d SAT calls.  ", Iter, Vec_IntSize(vMap) - Vec_IntCountPositive(vMap), Vec_IntSize(vPars), nRuns );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return nUnsats;
}